

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::TerminatedEvent>::copyConstruct
          (BasicTypeInfo<dap::TerminatedEvent> *this,void *dst,void *src)

{
  void *src_local;
  void *dst_local;
  BasicTypeInfo<dap::TerminatedEvent> *this_local;
  
  TerminatedEvent::TerminatedEvent((TerminatedEvent *)dst,(TerminatedEvent *)src);
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }